

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O1

bool __thiscall DSDcc::DSDDstar::DPRS::matchDSTAR(DPRS *this,char *d)

{
  char cVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  double deg;
  char latStr [8];
  char lonStr [9];
  double local_48;
  undefined4 local_40;
  undefined3 uStack_3c;
  undefined1 local_39;
  undefined8 local_38;
  undefined1 local_30;
  
  pcVar2 = strstr(d,"DSTAR*:/");
  if (pcVar2 != (char *)0x0) {
    local_40 = *(undefined4 *)(pcVar2 + 0xf);
    uStack_3c = (undefined3)((uint)*(undefined4 *)(pcVar2 + 0x12) >> 8);
    local_39 = 0;
    cVar1 = pcVar2[0x16];
    dVar3 = atof((char *)&local_40);
    dVar3 = modf(dVar3 * 0.01,&local_48);
    dVar3 = dVar3 * 1.6666666666666667 + local_48;
    if (cVar1 != 'N') {
      dVar3 = -dVar3;
    }
    this->m_lat = (float)dVar3;
    local_38 = *(undefined8 *)(pcVar2 + 0x18);
    local_30 = 0;
    cVar1 = pcVar2[0x20];
    dVar4 = atof((char *)&local_38);
    dVar4 = modf(dVar4 * 0.01,&local_48);
    local_48 = dVar4 * 1.6666666666666667 + local_48;
    if (cVar1 != 'E') {
      local_48 = -local_48;
    }
    this->m_lon = (float)local_48;
    Locator::setLatLon(&(this->m_locPoint).m_locator,(float)dVar3,(float)local_48);
  }
  return pcVar2 != (char *)0x0;
}

Assistant:

bool DSDDstar::DPRS::matchDSTAR(const char *d)
{
    const char *pch;
    char latStr[7+1];
    char lonStr[8+1];
    char latH, lonH;
    double x, min, deg;

    pch = strstr (d, "DSTAR*:/");

    if (pch)
    {
        pch += 15;

        memcpy(latStr, pch, 7);
        latStr[7] = '\0';
        latH = pch[7];
        x = atof(latStr);
        x /= 100.0f;
        min = modf(x, &deg);
        m_lat = (deg + ((min*100.0f)/60.0f))*(latH == 'N' ? 1 : -1);

        pch += 9;

        memcpy(lonStr, pch, 8);
        lonStr[8] = '\0';
        lonH = pch[8];
        x = atof(lonStr);
        x /= 100.0f;
        min = modf(x, &deg);
        m_lon = (deg + ((min*100.0f)/60.0f))*(lonH == 'E' ? 1 : -1);

        m_locPoint.setLatLon(m_lat, m_lon);

        return true;
    }
    else
    {
        return false;
    }
}